

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpListener.c
# Opt level: O0

sbfTcpListener_conflict
sbfTcpListener_create
          (sbfLog log,sbfMwThreadImpl *thread,sbfQueueImpl *queue,sbfTcpConnectionAddress *address,
          int isUnix,sbfTcpListenerReadyCb readyCb,sbfTcpListenerAcceptCb acceptCb,void *closure)

{
  sbfLog psVar1;
  uint16_t uVar2;
  undefined8 uVar3;
  evconnlistener *peVar4;
  long in_RCX;
  sbfQueue in_RDX;
  sbfMwThread in_RSI;
  sbfLog in_RDI;
  int in_R8D;
  sbfTcpListenerReadyCb in_R9;
  sbfTcpListenerAcceptCb in_stack_00000008;
  void *in_stack_00000010;
  sbfTcpListener_conflict tl;
  sbfTcpListener_conflict local_8;
  
  local_8 = (sbfTcpListener_conflict)sbfMemory_calloc(1,0xb8);
  local_8->mLog = in_RDI;
  local_8->mThread = in_RSI;
  local_8->mQueue = in_RDX;
  local_8->mReadyCb = in_R9;
  local_8->mAcceptCb = in_stack_00000008;
  local_8->mClosure = in_stack_00000010;
  local_8->mIsUnix = in_R8D;
  local_8->mDestroyed = 0;
  sbfRefCount_init(&local_8->mRefCount,1);
  if (local_8->mIsUnix == 0) {
    psVar1 = local_8->mLog;
    uVar2 = ntohs(*(uint16_t *)(in_RCX + 2));
    sbfLog_log(psVar1,0,"creating TCP listener %p: port %hu",local_8,uVar2);
    uVar3 = sbfMw_getThreadEventBase(in_RSI);
    peVar4 = (evconnlistener *)
             evconnlistener_new_bind
                       (uVar3,sbfTcpListenerEventCb,local_8,0x1e,0xffffffff,in_RCX,0x10);
    local_8->mListener = peVar4;
  }
  else {
    sbfLog_log(local_8->mLog,0,"creating TCP listener %p: unix-path %s",local_8,in_RCX + 2);
    uVar3 = sbfMw_getThreadEventBase(in_RSI);
    peVar4 = (evconnlistener *)
             evconnlistener_new_bind
                       (uVar3,sbfTcpListenerEventCb,local_8,0x1e,0xffffffff,in_RCX,0x6e);
    local_8->mListener = peVar4;
  }
  if (local_8->mListener == (evconnlistener *)0x0) {
    sbfLog_log(local_8->mLog,3,"failed to create event listener");
    sbfTcpListener_destroy((sbfTcpListener_conflict)0x103214);
    local_8 = (sbfTcpListener_conflict)0x0;
  }
  else {
    sbfRefCount_increment(&local_8->mRefCount);
    sbfQueue_enqueue(in_RDX,sbfTcpListenerReadyQueueCb,local_8);
  }
  return local_8;
}

Assistant:

sbfTcpListener
sbfTcpListener_create (sbfLog log,
                       struct sbfMwThreadImpl* thread,
                       struct sbfQueueImpl* queue,
                       sbfTcpConnectionAddress* address,
                       int isUnix,
                       sbfTcpListenerReadyCb readyCb,
                       sbfTcpListenerAcceptCb acceptCb,
                       void* closure)
{
    sbfTcpListener     tl;

    tl = xcalloc (1, sizeof *tl);
    tl->mLog = log;
    tl->mThread = thread;
    tl->mQueue = queue;

    tl->mReadyCb = readyCb;
    tl->mAcceptCb = acceptCb;
    tl->mClosure = closure;
    tl->mIsUnix = isUnix;

    tl->mDestroyed = 0;
    sbfRefCount_init (&tl->mRefCount, 1);

    if (tl->mIsUnix) {
#ifdef WIN32
        sbfLog_err (tl->mLog, "failed to create event listener unix socket not supported on windows");
        goto fail;
#else
        sbfLog_debug (tl->mLog,
                      "creating TCP listener %p: unix-path %s",
                      tl,
                      address->sun.sun_path);
        tl->mListener = evconnlistener_new_bind (sbfMw_getThreadEventBase (thread),
                                                 sbfTcpListenerEventCb,
                                                 tl,
                                                 LEV_OPT_THREADSAFE|
                                                 LEV_OPT_CLOSE_ON_FREE|
                                                 LEV_OPT_CLOSE_ON_EXEC|
                                                 LEV_OPT_REUSEABLE,
                                                 -1,
                                                 (struct sockaddr*)&(address->sun),
                                                 sizeof(address->sun));
#endif
    } else {
        sbfLog_debug (tl->mLog,
                      "creating TCP listener %p: port %hu",
                      tl,
                      ntohs (address->sin.sin_port));
        tl->mListener = evconnlistener_new_bind (sbfMw_getThreadEventBase (thread),
                                                 sbfTcpListenerEventCb,
                                                 tl,
                                                 LEV_OPT_THREADSAFE|
                                                 LEV_OPT_CLOSE_ON_FREE|
                                                 LEV_OPT_CLOSE_ON_EXEC|
                                                 LEV_OPT_REUSEABLE,
                                                 -1,
                                                 (struct sockaddr*)&(address->sin),
                                                 sizeof(address->sin));
    }
    
    if (tl->mListener == NULL)
    {
        sbfLog_err (tl->mLog, "failed to create event listener");
        goto fail;
    }

    sbfRefCount_increment (&tl->mRefCount);
    sbfQueue_enqueue (queue, sbfTcpListenerReadyQueueCb, tl);

    return tl;

fail:
    sbfTcpListener_destroy (tl);
    return NULL;
}